

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.c
# Opt level: O2

char * curl_version(void)

{
  uint uVar1;
  undefined8 uVar2;
  size_t __n;
  char *__dest;
  long lVar3;
  ulong uVar4;
  char *__s;
  char *src [16];
  char psl_ver [30];
  char zstd_ver [30];
  char br_version [30];
  char z_version [30];
  char ssl_version [200];
  
  src[0] = "libcurl/8.14.0-DEV";
  Curl_ssl_version(ssl_version,200);
  src[1] = ssl_version;
  uVar2 = zlibVersion();
  curl_msnprintf(z_version,0x1e,"zlib/%s",uVar2);
  src[2] = z_version;
  brotli_version(br_version,0x1e);
  src[3] = br_version;
  zstd_version(zstd_ver,0x1e);
  src[4] = zstd_ver;
  uVar1 = psl_check_version_number(0);
  curl_msnprintf(psl_ver,0x1e,"libpsl/%d.%d.%d",(ulong)(uint)((int)uVar1 >> 0x10),
                 (ulong)(uVar1 >> 8 & 0xff),(ulong)(uVar1 & 0xff));
  src[5] = psl_ver;
  __dest = curl_version::out;
  uVar4 = 300;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    __s = src[lVar3];
    __n = strlen(__s);
    if (uVar4 <= __n + 2) break;
    if (lVar3 != 0) {
      *__dest = ' ';
      __dest = __dest + 1;
      uVar4 = uVar4 - 1;
      __s = src[lVar3];
    }
    memcpy(__dest,__s,__n);
    __dest = __dest + __n;
    uVar4 = uVar4 - __n;
  }
  *__dest = '\0';
  return curl_version::out;
}

Assistant:

char *curl_version(void)
{
  static char out[300];
  char *outp;
  size_t outlen;
  const char *src[VERSION_PARTS];
#ifdef USE_SSL
  char ssl_version[200];
#endif
#ifdef HAVE_LIBZ
  char z_version[30];
#endif
#ifdef HAVE_BROTLI
  char br_version[30];
#endif
#ifdef HAVE_ZSTD
  char zstd_ver[30];
#endif
#ifdef USE_ARES
  char cares_version[30];
#endif
#ifdef USE_IDN
  char idn_ver[30];
#endif
#ifdef USE_LIBPSL
  char psl_ver[30];
#endif
#ifdef USE_SSH
  char ssh_version[30];
#endif
#ifdef USE_NGHTTP2
  char h2_version[30];
#endif
#ifdef USE_HTTP3
  char h3_version[30];
#endif
#ifdef USE_LIBRTMP
  char rtmp_version[30];
#endif
#ifdef USE_GSASL
  char gsasl_buf[30];
#endif
#ifdef USE_OPENLDAP
  char ldap_buf[30];
#endif
  int i = 0;
  int j;

#ifdef DEBUGBUILD
  /* Override version string when environment variable CURL_VERSION is set */
  const char *debugversion = getenv("CURL_VERSION");
  if(debugversion) {
    msnprintf(out, sizeof(out), "%s", debugversion);
    return out;
  }
#endif

  src[i++] = LIBCURL_NAME "/" LIBCURL_VERSION;
#ifdef USE_SSL
  Curl_ssl_version(ssl_version, sizeof(ssl_version));
  src[i++] = ssl_version;
#endif
#ifdef HAVE_LIBZ
  msnprintf(z_version, sizeof(z_version), "zlib/%s", zlibVersion());
  src[i++] = z_version;
#endif
#ifdef HAVE_BROTLI
  brotli_version(br_version, sizeof(br_version));
  src[i++] = br_version;
#endif
#ifdef HAVE_ZSTD
  zstd_version(zstd_ver, sizeof(zstd_ver));
  src[i++] = zstd_ver;
#endif
#ifdef USE_ARES
  msnprintf(cares_version, sizeof(cares_version),
            "c-ares/%s", ares_version(NULL));
  src[i++] = cares_version;
#endif
#ifdef USE_IDN
  idn_version(idn_ver, sizeof(idn_ver));
  src[i++] = idn_ver;
#endif
#ifdef USE_LIBPSL
  psl_version(psl_ver, sizeof(psl_ver));
  src[i++] = psl_ver;
#endif
#ifdef USE_SSH
  Curl_ssh_version(ssh_version, sizeof(ssh_version));
  src[i++] = ssh_version;
#endif
#ifdef USE_NGHTTP2
  Curl_http2_ver(h2_version, sizeof(h2_version));
  src[i++] = h2_version;
#endif
#ifdef USE_HTTP3
  Curl_quic_ver(h3_version, sizeof(h3_version));
  src[i++] = h3_version;
#endif
#ifdef USE_LIBRTMP
  Curl_rtmp_version(rtmp_version, sizeof(rtmp_version));
  src[i++] = rtmp_version;
#endif
#ifdef USE_GSASL
  msnprintf(gsasl_buf, sizeof(gsasl_buf), "libgsasl/%s",
            gsasl_check_version(NULL));
  src[i++] = gsasl_buf;
#endif
#ifdef USE_OPENLDAP
  oldap_version(ldap_buf, sizeof(ldap_buf));
  src[i++] = ldap_buf;
#endif

  DEBUGASSERT(i <= VERSION_PARTS);

  outp = &out[0];
  outlen = sizeof(out);
  for(j = 0; j < i; j++) {
    size_t n = strlen(src[j]);
    /* we need room for a space, the string and the final zero */
    if(outlen <= (n + 2))
      break;
    if(j) {
      /* prepend a space if not the first */
      *outp++ = ' ';
      outlen--;
    }
    memcpy(outp, src[j], n);
    outp += n;
    outlen -= n;
  }
  *outp = 0;

  return out;
}